

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O2

string * __thiscall
tinyusdz::print_typed_attr<std::vector<std::array<float,3ul>,std::allocator<std::array<float,3ul>>>>
          (string *__return_storage_ptr__,tinyusdz *this,
          TypedAttribute<tinyusdz::Animatable<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>_>
          *attr,string *name,uint32_t indent)

{
  tinyusdz tVar1;
  char cVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  value_type *pvVar6;
  ostream *poVar7;
  long lVar8;
  uint32_t indent_00;
  pointer pSVar9;
  uint32_t n;
  uint32_t n_00;
  uint32_t extraout_EDX;
  uint32_t extraout_EDX_00;
  uint32_t n_01;
  TypedTimeSamples<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>
  *v;
  bool bVar10;
  bool bVar11;
  vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> a;
  stringstream ss;
  string local_248;
  string *local_228;
  optional<tinyusdz::Animatable<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>_>
  local_220;
  string local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  
  v = (TypedTimeSamples<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>
       *)((ulong)name & 0xffffffff);
  ::std::__cxx11::stringstream::stringstream(local_1b8);
  bVar3 = TypedAttribute<tinyusdz::Animatable<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>_>
          ::authored((TypedAttribute<tinyusdz::Animatable<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>_>
                      *)this);
  if (bVar3) {
    local_228 = __return_storage_ptr__;
    bVar3 = TypedAttribute<tinyusdz::Animatable<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>_>
            ::is_value_empty((TypedAttribute<tinyusdz::Animatable<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>_>
                              *)this);
    pSVar9 = *(pointer *)(this + 0x218);
    bVar10 = pSVar9 != *(pointer *)(this + 0x210);
    tVar1 = this[0x228];
    nonstd::optional_lite::
    optional<tinyusdz::Animatable<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>_>
    ::optional(&local_220,
               (optional<tinyusdz::Animatable<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>_>
                *)(this + 0x228));
    if (local_220.has_value_ == true) {
      pvVar6 = nonstd::optional_lite::
               optional<tinyusdz::Animatable<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>_>
               ::value(&local_220);
      cVar2 = pvVar6->_has_value;
    }
    else {
      cVar2 = '\0';
    }
    if ((local_220.has_value_ & 1U) == 0) {
      bVar4 = false;
    }
    else {
      pvVar6 = nonstd::optional_lite::
               optional<tinyusdz::Animatable<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>_>
               ::value(&local_220);
      bVar4 = Animatable<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>
              ::has_timesamples(pvVar6);
    }
    if ((((local_220.has_value_ & 1U) == 0) ||
        (pvVar6 = nonstd::optional_lite::
                  optional<tinyusdz::Animatable<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>_>
                  ::value(&local_220), pvVar6->_blocked != false)) || (pvVar6->_has_value != false))
    {
      bVar11 = false;
    }
    else {
      pSVar9 = (pvVar6->_ts)._samples.
               super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>::Sample>_>
               ._M_impl.super__Vector_impl_data._M_start;
      bVar11 = pSVar9 != (pvVar6->_ts)._samples.
                         super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>::Sample>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
    }
    indent_00 = (uint32_t)pSVar9;
    bVar5 = AttrMetas::authored((AttrMetas *)this);
    if (((bVar5) || ((byte)(bVar10 & ((byte)tVar1 ^ 1) | bVar11) != 1)) ||
       (n_01 = n, (bVar3 || this[0x270] != (tinyusdz)0x0) || cVar2 != '\0')) {
      pprint::Indent_abi_cxx11_(&local_248,(pprint *)v,n);
      ::std::operator<<(local_1a8,(string *)&local_248);
      ::std::__cxx11::string::_M_dispose();
      value::TypeTraits<std::vector<std::array<float,3ul>,std::allocator<std::array<float,3ul>>>>::
      type_name_abi_cxx11_();
      poVar7 = ::std::operator<<(local_1a8,(string *)&local_248);
      poVar7 = ::std::operator<<(poVar7," ");
      ::std::operator<<(poVar7,(string *)attr);
      ::std::__cxx11::string::_M_dispose();
      if (this[0x270] == (tinyusdz)0x1) {
        ::std::operator<<(local_1a8," = None");
      }
      else if (cVar2 != '\0') {
        local_248._M_dataplus._M_p = (pointer)0x0;
        local_248._M_string_length = 0;
        local_248.field_2._M_allocated_capacity = 0;
        pvVar6 = nonstd::optional_lite::
                 optional<tinyusdz::Animatable<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>_>
                 ::value(&local_220);
        bVar3 = Animatable<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>
                ::get_scalar(pvVar6,(vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                                     *)&local_248);
        if (bVar3) {
          poVar7 = ::std::operator<<(local_1a8," = ");
          ::std::operator<<(poVar7,(vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                                    *)&local_248);
        }
        else {
          ::std::operator<<(local_1a8," = [InternalError]");
        }
        ::std::_Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::
        ~_Vector_base((_Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                       *)&local_248);
      }
      bVar3 = AttrMetas::authored((AttrMetas *)this);
      if (bVar3) {
        poVar7 = ::std::operator<<(local_1a8,"(\n");
        print_attr_metas_abi_cxx11_(&local_248,this,(AttrMeta *)(ulong)((int)name + 1),indent_00);
        poVar7 = ::std::operator<<(poVar7,(string *)&local_248);
        pprint::Indent_abi_cxx11_(&local_1d8,(pprint *)((ulong)name & 0xffffffff),n_00);
        poVar7 = ::std::operator<<(poVar7,(string *)&local_1d8);
        ::std::operator<<(poVar7,")");
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
      }
      ::std::operator<<(local_1a8,"\n");
      n_01 = extraout_EDX;
    }
    if (bVar4 != false) {
      pprint::Indent_abi_cxx11_(&local_248,(pprint *)v,n_01);
      ::std::operator<<(local_1a8,(string *)&local_248);
      ::std::__cxx11::string::_M_dispose();
      value::TypeTraits<std::vector<std::array<float,3ul>,std::allocator<std::array<float,3ul>>>>::
      type_name_abi_cxx11_();
      poVar7 = ::std::operator<<(local_1a8,(string *)&local_248);
      poVar7 = ::std::operator<<(poVar7," ");
      ::std::operator<<(poVar7,(string *)attr);
      ::std::__cxx11::string::_M_dispose();
      poVar7 = ::std::operator<<(local_1a8,".timeSamples = ");
      pvVar6 = nonstd::optional_lite::
               optional<tinyusdz::Animatable<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>_>
               ::value(&local_220);
      print_typed_timesamples<std::vector<std::array<float,3ul>,std::allocator<std::array<float,3ul>>>>
                (&local_248,(tinyusdz *)&pvVar6->_ts,v,indent_00);
      ::std::operator<<(poVar7,(string *)&local_248);
      ::std::__cxx11::string::_M_dispose();
      ::std::operator<<(local_1a8,"\n");
      n_01 = extraout_EDX_00;
    }
    __return_storage_ptr__ = local_228;
    if (*(long *)(this + 0x218) != *(long *)(this + 0x210)) {
      pprint::Indent_abi_cxx11_(&local_248,(pprint *)v,n_01);
      ::std::operator<<(local_1a8,(string *)&local_248);
      ::std::__cxx11::string::_M_dispose();
      value::TypeTraits<std::vector<std::array<float,3ul>,std::allocator<std::array<float,3ul>>>>::
      type_name_abi_cxx11_();
      poVar7 = ::std::operator<<(local_1a8,(string *)&local_248);
      poVar7 = ::std::operator<<(poVar7," ");
      ::std::operator<<(poVar7,(string *)attr);
      ::std::__cxx11::string::_M_dispose();
      ::std::operator<<(local_1a8,".connect = ");
      lVar8 = (*(long *)(this + 0x218) - (long)*(Path **)(this + 0x210)) / 0xd0;
      if (lVar8 == 0) {
        ::std::operator<<(local_1a8,"[InternalError]");
      }
      else if (lVar8 == 1) {
        ::std::operator<<(local_1a8,*(Path **)(this + 0x210));
      }
      else {
        ::std::operator<<(local_1a8,
                          (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)(this + 0x210))
        ;
      }
      ::std::operator<<(local_1a8,"\n");
    }
    nonstd::optional_lite::
    optional<tinyusdz::Animatable<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>_>
    ::~optional(&local_220);
  }
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::stringstream::~stringstream(local_1b8);
  return __return_storage_ptr__;
}

Assistant:

std::string print_typed_attr(const TypedAttribute<Animatable<T>> &attr,
                             const std::string &name, const uint32_t indent) {
  std::stringstream ss;

  if (attr.authored()) {

    bool is_value_empty = attr.is_value_empty();
    bool is_connection = attr.is_connection();
    bool has_default{false};
    bool has_timesamples{false};
    bool is_timesamples{false};
    const auto &pv = attr.get_value();

    has_default = (pv && pv.value().has_default());
    has_timesamples = (pv && pv.value().has_timesamples());
    is_timesamples = (pv && pv.value().is_timesamples());

    DCOUT("name " << name);
    DCOUT("is_value_empty " << is_value_empty);
    DCOUT("is_connection " << is_connection);
    DCOUT("is_timesamples " << is_timesamples);
    DCOUT("has_timesamples " << has_timesamples);
    DCOUT("has_default " << has_default);

    //
    // Emit default value(includes ValueBlock and empty definition) and metada
    //
    // float a METADATA
    // float a = None METADATA
    // float a = 1.5 METADATA
    // 
    // Also emit this line if the attribute contains metadata
    // Do not emit when Attribute is connection only or timesamples only.
    if (attr.metas().authored() || attr.is_blocked() || has_default || is_value_empty || ((!is_connection) && (!is_timesamples))) {

      ss << pprint::Indent(indent);
      ss << value::TypeTraits<T>::type_name() << " " << name;

      if (attr.is_blocked()) {
        ss << " = None";
      } else if (has_default) {
        T a;
        if (pv.value().get_scalar(&a)) {
          ss << " = " << a;
        } else {
          ss << " = [InternalError]";
        }
      } else { // is_value_empty
      }

      if (attr.metas().authored()) {
        ss << "(\n"
           << print_attr_metas(attr.metas(), indent + 1) << pprint::Indent(indent)
           << ")";
      }
      ss << "\n";
    }

    // timesamples
    if (has_timesamples) {
      ss << pprint::Indent(indent);
      ss << value::TypeTraits<T>::type_name() << " " << name;
      ss << ".timeSamples = "
         << print_typed_timesamples(pv.value().get_timesamples(), indent);
      ss << "\n";
    }

    // connection
    if (attr.has_connections()) {

      ss << pprint::Indent(indent);
      ss << value::TypeTraits<T>::type_name() << " " << name;

      ss << ".connect = ";
      const std::vector<Path> &paths = attr.get_connections();
      if (paths.size() == 1) {
        ss << paths[0];
      } else if (paths.size() == 0) {
        ss << "[InternalError]";
      } else {
        ss << paths;
      }
      ss << "\n";
    }

  }

  return ss.str();
}